

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RtAudio.cpp
# Opt level: O2

RtAudioErrorType __thiscall RtApiAlsa::abortStream(RtApiAlsa *this)

{
  StreamMutex *__mutex;
  StreamState SVar1;
  undefined8 *puVar2;
  RtAudioErrorType type;
  int iVar3;
  StreamMode SVar4;
  ostream *poVar5;
  char *pcVar6;
  string asStack_48 [32];
  
  SVar1 = (this->super_RtApi).stream_.state;
  if ((SVar1 == STREAM_CLOSED) || (SVar1 == STREAM_STOPPED)) {
LAB_0010ea12:
    std::__cxx11::string::assign((char *)&(this->super_RtApi).errorText_);
  }
  else {
    if (SVar1 == STREAM_RUNNING) {
      (this->super_RtApi).stream_.state = STREAM_STOPPED;
      __mutex = &(this->super_RtApi).stream_.mutex;
      pthread_mutex_lock((pthread_mutex_t *)__mutex);
      puVar2 = (undefined8 *)(this->super_RtApi).stream_.apiHandle;
      SVar4 = (this->super_RtApi).stream_.mode;
      if ((SVar4 & ~DUPLEX) == OUTPUT) {
        iVar3 = snd_pcm_drop(*puVar2);
        if (-1 < iVar3) {
          SVar4 = (this->super_RtApi).stream_.mode;
          goto LAB_0010ea77;
        }
        pcVar6 = "RtApiAlsa::abortStream: error aborting output pcm device, ";
      }
      else {
LAB_0010ea77:
        if (((1 < (uint)(SVar4 + ~OUTPUT)) || (*(char *)(puVar2 + 2) != '\0')) ||
           (iVar3 = snd_pcm_drop(puVar2[1]), -1 < iVar3)) {
          *(undefined1 *)(puVar2 + 9) = 0;
          pthread_mutex_unlock((pthread_mutex_t *)__mutex);
          return RTAUDIO_NO_ERROR;
        }
        pcVar6 = "RtApiAlsa::abortStream: error aborting input pcm device, ";
      }
      poVar5 = std::operator<<((ostream *)&(this->super_RtApi).errorStream_,pcVar6);
      pcVar6 = (char *)snd_strerror(iVar3);
      poVar5 = std::operator<<(poVar5,pcVar6);
      std::operator<<(poVar5,".");
      std::__cxx11::stringbuf::str();
      std::__cxx11::string::operator=((string *)&(this->super_RtApi).errorText_,asStack_48);
      std::__cxx11::string::~string(asStack_48);
      *(undefined1 *)(puVar2 + 9) = 0;
      pthread_mutex_unlock((pthread_mutex_t *)__mutex);
      type = RTAUDIO_SYSTEM_ERROR;
      goto LAB_0010ea20;
    }
    if (SVar1 == STREAM_STOPPING) goto LAB_0010ea12;
  }
  type = RTAUDIO_WARNING;
LAB_0010ea20:
  RtApi::error(&this->super_RtApi,type);
  return type;
}

Assistant:

RtAudioErrorType RtApiAlsa :: abortStream()
{
  if ( stream_.state != STREAM_RUNNING ) {
    if ( stream_.state == STREAM_STOPPED )
      errorText_ = "RtApiAlsa::abortStream(): the stream is already stopped!";
    else if ( stream_.state == STREAM_STOPPING || stream_.state == STREAM_CLOSED )
      errorText_ = "RtApiAlsa::abortStream(): the stream is stopping or closed!";
    return error( RTAUDIO_WARNING );
  }

  stream_.state = STREAM_STOPPED;
  MUTEX_LOCK( &stream_.mutex );

  int result = 0;
  AlsaHandle *apiInfo = (AlsaHandle *) stream_.apiHandle;
  snd_pcm_t **handle = (snd_pcm_t **) apiInfo->handles;
  if ( stream_.mode == OUTPUT || stream_.mode == DUPLEX ) {
    result = snd_pcm_drop( handle[0] );
    if ( result < 0 ) {
      errorStream_ << "RtApiAlsa::abortStream: error aborting output pcm device, " << snd_strerror( result ) << ".";
      errorText_ = errorStream_.str();
      goto unlock;
    }
  }

  if ( ( stream_.mode == INPUT || stream_.mode == DUPLEX ) && !apiInfo->synchronized ) {
    result = snd_pcm_drop( handle[1] );
    if ( result < 0 ) {
      errorStream_ << "RtApiAlsa::abortStream: error aborting input pcm device, " << snd_strerror( result ) << ".";
      errorText_ = errorStream_.str();
      goto unlock;
    }
  }

 unlock:
  apiInfo->runnable = false; // fixes high CPU usage when stopped
  MUTEX_UNLOCK( &stream_.mutex );

  if ( result < 0 ) return error( RTAUDIO_SYSTEM_ERROR );
  return RTAUDIO_NO_ERROR;
}